

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vnode.c
# Opt level: O0

int get_one_event(inotify_event *dst,size_t len,int inofd)

{
  ssize_t sVar1;
  int *piVar2;
  int in_EDX;
  ulong in_RSI;
  void *in_RDI;
  size_t want;
  ssize_t n;
  ulong local_30;
  
  local_30 = 0x10;
  while( true ) {
    if (in_RSI < local_30) {
      return -1;
    }
    sVar1 = read(in_EDX,in_RDI,local_30);
    if (-1 < sVar1) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      if (*piVar2 != 0x16) {
        return -1;
      }
      local_30 = local_30 + 0x10;
    }
  }
  return 0;
}

Assistant:

int
get_one_event(struct inotify_event *dst, size_t len, int inofd)
{
    ssize_t n;
    size_t want = sizeof(struct inotify_event);

    dbg_puts("reading one inotify event");
    for (;;) {
        if (len < want) {
            dbg_printf("Needed %zu bytes have %zu bytes", want, len);
            return (-1);
        }

        /*
         * Last member of struct inotify_event is the name field.
         * this field will be padded to the next multiple of
         * struct inotify_event.
         *
         * We need this loop here so that we don't accidentally
         * read more than one inotify event per read call which
         * could happen if the event's name field were 0.
         */
        n = read(inofd, dst, want);
        if (n < 0) {
            switch (errno) {
            case EINVAL:
                want += sizeof(struct inotify_event);
                /* FALL-THROUGH */

            case EINTR:
                continue;
            }

            dbg_perror("read");
            return (-1);
        }
        break;
    }

    dbg_printf("read(2) from inotify wd: %ld bytes", (long)n);

#ifdef __COVERITY__
    /* Coverity complains this isn't \0 terminated, but it is */
    if (evt->len > 0) evt->name[ev->len - 1] = '\0';
#endif

    return (0);
}